

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaSAXHandleReference(void *ctx,xmlChar *name)

{
  xmlGenericErrorFunc UNRECOVERED_JUMPTABLE;
  xmlGenericErrorFunc *pp_Var1;
  void **ppvVar2;
  xmlSchemaValidCtxtPtr vctxt;
  
  if ((-1 < *(int *)((long)ctx + 0xac)) &&
     (*(int *)((long)ctx + 0x130) == -1 || *(int *)((long)ctx + 0xac) < *(int *)((long)ctx + 0x130))
     ) {
    pp_Var1 = __xmlGenericError();
    UNRECOVERED_JUMPTABLE = *pp_Var1;
    ppvVar2 = __xmlGenericErrorContext();
    (*UNRECOVERED_JUMPTABLE)
              (*ppvVar2,"Unimplemented block at %s:%d\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemas.c"
               ,0x6b71,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

static void
xmlSchemaSAXHandleReference(void *ctx ATTRIBUTE_UNUSED,
			    const xmlChar * name ATTRIBUTE_UNUSED)
{
    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) ctx;

    if (vctxt->depth < 0)
	return;
    if ((vctxt->skipDepth != -1) && (vctxt->depth >= vctxt->skipDepth))
	return;
    /* SAX VAL TODO: What to do here? */
    TODO
}